

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,slang::ast::SampledValueExprVisitor&>
          (Expression *this,Expression *expr,SampledValueExprVisitor *visitor)

{
  logic_error *this_00;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  SampledValueExprVisitor *local_20;
  SampledValueExprVisitor *visitor_local;
  Expression *expr_local;
  Expression *this_local;
  
  local_20 = visitor;
  visitor_local = (SampledValueExprVisitor *)expr;
  expr_local = this;
  switch(expr->kind) {
  case Invalid:
    SampledValueExprVisitor::visitInvalid(visitor,expr);
    break;
  case IntegerLiteral:
    SampledValueExprVisitor::visit<slang::ast::IntegerLiteral>(visitor,(IntegerLiteral *)expr);
    break;
  case RealLiteral:
    SampledValueExprVisitor::visit<slang::ast::RealLiteral>(visitor,(RealLiteral *)expr);
    break;
  case TimeLiteral:
    SampledValueExprVisitor::visit<slang::ast::TimeLiteral>(visitor,(TimeLiteral *)expr);
    break;
  case UnbasedUnsizedIntegerLiteral:
    SampledValueExprVisitor::visit<slang::ast::UnbasedUnsizedIntegerLiteral>
              (visitor,(UnbasedUnsizedIntegerLiteral *)expr);
    break;
  case NullLiteral:
    SampledValueExprVisitor::visit<slang::ast::NullLiteral>(visitor,(NullLiteral *)expr);
    break;
  case UnboundedLiteral:
    SampledValueExprVisitor::visit<slang::ast::UnboundedLiteral>(visitor,(UnboundedLiteral *)expr);
    break;
  case StringLiteral:
    SampledValueExprVisitor::visit<slang::ast::StringLiteral>(visitor,(StringLiteral *)expr);
    break;
  case NamedValue:
    SampledValueExprVisitor::visit<slang::ast::NamedValueExpression>
              (visitor,(NamedValueExpression *)expr);
    break;
  case HierarchicalValue:
    SampledValueExprVisitor::visit<slang::ast::HierarchicalValueExpression>
              (visitor,(HierarchicalValueExpression *)expr);
    break;
  case UnaryOp:
    SampledValueExprVisitor::visit<slang::ast::UnaryExpression>(visitor,(UnaryExpression *)expr);
    break;
  case BinaryOp:
    SampledValueExprVisitor::visit<slang::ast::BinaryExpression>(visitor,(BinaryExpression *)expr);
    break;
  case ConditionalOp:
    SampledValueExprVisitor::visit<slang::ast::ConditionalExpression>
              (visitor,(ConditionalExpression *)expr);
    break;
  case Inside:
    SampledValueExprVisitor::visit<slang::ast::InsideExpression>(visitor,(InsideExpression *)expr);
    break;
  case Assignment:
    SampledValueExprVisitor::visit<slang::ast::AssignmentExpression>
              (visitor,(AssignmentExpression *)expr);
    break;
  case Concatenation:
    SampledValueExprVisitor::visit<slang::ast::ConcatenationExpression>
              (visitor,(ConcatenationExpression *)expr);
    break;
  case Replication:
    SampledValueExprVisitor::visit<slang::ast::ReplicationExpression>
              (visitor,(ReplicationExpression *)expr);
    break;
  case Streaming:
    SampledValueExprVisitor::visit<slang::ast::StreamingConcatenationExpression>
              (visitor,(StreamingConcatenationExpression *)expr);
    break;
  case ElementSelect:
    SampledValueExprVisitor::visit<slang::ast::ElementSelectExpression>
              (visitor,(ElementSelectExpression *)expr);
    break;
  case RangeSelect:
    SampledValueExprVisitor::visit<slang::ast::RangeSelectExpression>
              (visitor,(RangeSelectExpression *)expr);
    break;
  case MemberAccess:
    SampledValueExprVisitor::visit<slang::ast::MemberAccessExpression>
              (visitor,(MemberAccessExpression *)expr);
    break;
  case Call:
    SampledValueExprVisitor::visit<slang::ast::CallExpression>(visitor,(CallExpression *)expr);
    break;
  case Conversion:
    SampledValueExprVisitor::visit<slang::ast::ConversionExpression>
              (visitor,(ConversionExpression *)expr);
    break;
  case DataType:
    SampledValueExprVisitor::visit<slang::ast::DataTypeExpression>
              (visitor,(DataTypeExpression *)expr);
    break;
  case TypeReference:
    SampledValueExprVisitor::visit<slang::ast::TypeReferenceExpression>
              (visitor,(TypeReferenceExpression *)expr);
    break;
  case HierarchicalReference:
    SampledValueExprVisitor::visit<slang::ast::HierarchicalReferenceExpression>
              (visitor,(HierarchicalReferenceExpression *)expr);
    break;
  case LValueReference:
    SampledValueExprVisitor::visit<slang::ast::LValueReferenceExpression>
              (visitor,(LValueReferenceExpression *)expr);
    break;
  case SimpleAssignmentPattern:
    SampledValueExprVisitor::visit<slang::ast::SimpleAssignmentPatternExpression>
              (visitor,(SimpleAssignmentPatternExpression *)expr);
    break;
  case StructuredAssignmentPattern:
    SampledValueExprVisitor::visit<slang::ast::StructuredAssignmentPatternExpression>
              (visitor,(StructuredAssignmentPatternExpression *)expr);
    break;
  case ReplicatedAssignmentPattern:
    SampledValueExprVisitor::visit<slang::ast::ReplicatedAssignmentPatternExpression>
              (visitor,(ReplicatedAssignmentPatternExpression *)expr);
    break;
  case EmptyArgument:
    SampledValueExprVisitor::visit<slang::ast::EmptyArgumentExpression>
              (visitor,(EmptyArgumentExpression *)expr);
    break;
  case OpenRange:
    SampledValueExprVisitor::visit<slang::ast::OpenRangeExpression>
              (visitor,(OpenRangeExpression *)expr);
    break;
  case Dist:
    SampledValueExprVisitor::visit<slang::ast::DistExpression>(visitor,(DistExpression *)expr);
    break;
  case NewArray:
    SampledValueExprVisitor::visit<slang::ast::NewArrayExpression>
              (visitor,(NewArrayExpression *)expr);
    break;
  case NewClass:
    SampledValueExprVisitor::visit<slang::ast::NewClassExpression>
              (visitor,(NewClassExpression *)expr);
    break;
  case NewCovergroup:
    SampledValueExprVisitor::visit<slang::ast::NewCovergroupExpression>
              (visitor,(NewCovergroupExpression *)expr);
    break;
  case CopyClass:
    SampledValueExprVisitor::visit<slang::ast::CopyClassExpression>
              (visitor,(CopyClassExpression *)expr);
    break;
  case MinTypMax:
    SampledValueExprVisitor::visit<slang::ast::MinTypMaxExpression>
              (visitor,(MinTypMaxExpression *)expr);
    break;
  case ClockingEvent:
    SampledValueExprVisitor::visit<slang::ast::ClockingEventExpression>
              (visitor,(ClockingEventExpression *)expr);
    break;
  case AssertionInstance:
    SampledValueExprVisitor::visit<slang::ast::AssertionInstanceExpression>
              (visitor,(AssertionInstanceExpression *)expr);
    break;
  case TaggedUnion:
    SampledValueExprVisitor::visit<slang::ast::TaggedUnionExpression>
              (visitor,(TaggedUnionExpression *)expr);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_c1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_f8,0x15b);
    std::operator+(&local_80,&local_a0,&local_f8);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}